

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogWriter.cpp
# Opt level: O2

void xe::writeTestResult(TestCaseResult *result,Writer *xmlWriter)

{
  pointer ppIVar1;
  Writer *pWVar2;
  char *pcVar3;
  int ndx;
  long lVar4;
  Attribute AStack_f8;
  Attribute local_b8;
  BeginElement local_78;
  Attribute local_58;
  
  xml::Writer::BeginElement::BeginElement(&local_78,"TestCaseResult");
  pWVar2 = xml::Writer::operator<<(xmlWriter,&local_78);
  xml::Writer::Attribute::Attribute(&AStack_f8,"Version","0.3.3");
  pWVar2 = xml::Writer::operator<<(pWVar2,&AStack_f8);
  xml::Writer::Attribute::Attribute(&local_b8,"CasePath",(string *)result);
  pWVar2 = xml::Writer::operator<<(pWVar2,&local_b8);
  pcVar3 = getTestCaseTypeName((result->super_TestCaseResultHeader).caseType);
  xml::Writer::Attribute::Attribute(&local_58,"CaseType",pcVar3);
  xml::Writer::operator<<(pWVar2,&local_58);
  xml::Writer::Attribute::~Attribute(&local_58);
  xml::Writer::Attribute::~Attribute(&local_b8);
  xml::Writer::Attribute::~Attribute(&AStack_f8);
  std::__cxx11::string::~string((string *)&local_78);
  for (lVar4 = 0;
      ppIVar1 = (result->resultItems).m_items.
                super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      lVar4 < (int)((ulong)((long)(result->resultItems).m_items.
                                  super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3);
      lVar4 = lVar4 + 1) {
    writeResultItem(ppIVar1[lVar4],xmlWriter);
  }
  xml::Writer::BeginElement::BeginElement((BeginElement *)&local_b8,"Result");
  pWVar2 = xml::Writer::operator<<(xmlWriter,(BeginElement *)&local_b8);
  pcVar3 = getTestStatusCodeName((result->super_TestCaseResultHeader).statusCode);
  xml::Writer::Attribute::Attribute(&AStack_f8,"StatusCode",pcVar3);
  pWVar2 = xml::Writer::operator<<(pWVar2,&AStack_f8);
  pWVar2 = xml::Writer::operator<<(pWVar2,&(result->super_TestCaseResultHeader).statusDetails);
  xml::Writer::operator<<(pWVar2,(EndElementType *)&xml::Writer::EndElement);
  xml::Writer::Attribute::~Attribute(&AStack_f8);
  std::__cxx11::string::~string((string *)&local_b8);
  xml::Writer::operator<<(xmlWriter,(EndElementType *)&xml::Writer::EndElement);
  return;
}

Assistant:

void writeTestResult (const TestCaseResult& result, xe::xml::Writer& xmlWriter)
{
	using xml::Writer;

	xmlWriter << Writer::BeginElement("TestCaseResult")
			  << Writer::Attribute("Version", TEST_LOG_VERSION)
			  << Writer::Attribute("CasePath", result.casePath)
			  << Writer::Attribute("CaseType", getTestCaseTypeName(result.caseType));

	for (int ndx = 0; ndx < result.resultItems.getNumItems(); ndx++)
		writeResultItem(result.resultItems.getItem(ndx), xmlWriter);

	// Result item is not logged until end.
	xmlWriter << Writer::BeginElement("Result")
			  << Writer::Attribute("StatusCode", getTestStatusCodeName(result.statusCode))
			  << result.statusDetails
			  << Writer::EndElement;

	xmlWriter << Writer::EndElement;
}